

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_shader.cpp
# Opt level: O0

void __thiscall FShaderManager::ApplyMatrices(FShaderManager *this,VSMatrix *proj,VSMatrix *view)

{
  _func_void_GLfloat_ptr *p_Var1;
  int iVar2;
  uint uVar3;
  FLOATTYPE *pFVar4;
  FShader **ppFVar5;
  int local_2c;
  uint local_28;
  int i_2;
  uint i_1;
  int i;
  VSMatrix *view_local;
  VSMatrix *proj_local;
  FShaderManager *this_local;
  
  if (gl.legacyMode) {
    (*_ptrc_glMatrixMode)(0x1701);
    p_Var1 = _ptrc_glLoadMatrixf;
    pFVar4 = VSMatrix::get(proj);
    (*p_Var1)(pFVar4);
    (*_ptrc_glMatrixMode)(0x1700);
    p_Var1 = _ptrc_glLoadMatrixf;
    pFVar4 = VSMatrix::get(view);
    (*p_Var1)(pFVar4);
  }
  else {
    for (i_2 = 0; i_2 < 4; i_2 = i_2 + 1) {
      ppFVar5 = TArray<FShader_*,_FShader_*>::operator[](&this->mTextureEffects,(long)i_2);
      FShader::ApplyMatrices(*ppFVar5,proj,view);
      ppFVar5 = TArray<FShader_*,_FShader_*>::operator[](&this->mTextureEffectsNAT,(long)i_2);
      FShader::ApplyMatrices(*ppFVar5,proj,view);
    }
    ppFVar5 = TArray<FShader_*,_FShader_*>::operator[](&this->mTextureEffects,4);
    FShader::ApplyMatrices(*ppFVar5,proj,view);
    iVar2 = FIntCVar::operator_cast_to_int(&gl_fuzztype);
    if (iVar2 != 0) {
      iVar2 = FIntCVar::operator_cast_to_int(&gl_fuzztype);
      ppFVar5 = TArray<FShader_*,_FShader_*>::operator[](&this->mTextureEffects,(long)(iVar2 + 4));
      FShader::ApplyMatrices(*ppFVar5,proj,view);
    }
    for (local_28 = 0xc; uVar3 = TArray<FShader_*,_FShader_*>::Size(&this->mTextureEffects),
        local_28 < uVar3; local_28 = local_28 + 1) {
      ppFVar5 = TArray<FShader_*,_FShader_*>::operator[](&this->mTextureEffects,(ulong)local_28);
      FShader::ApplyMatrices(*ppFVar5,proj,view);
    }
    for (local_2c = 0; local_2c < 4; local_2c = local_2c + 1) {
      FShader::ApplyMatrices(this->mEffectShaders[local_2c],proj,view);
    }
    if (this->mActiveShader != (FShader *)0x0) {
      FShader::Bind(this->mActiveShader);
    }
  }
  return;
}

Assistant:

void FShaderManager::ApplyMatrices(VSMatrix *proj, VSMatrix *view)
{
	if (gl.legacyMode)
	{
		glMatrixMode(GL_PROJECTION);
		glLoadMatrixf(proj->get());
		glMatrixMode(GL_MODELVIEW);
		glLoadMatrixf(view->get());
	}
	else
	{
		for (int i = 0; i < 4; i++)
		{
			mTextureEffects[i]->ApplyMatrices(proj, view);
			mTextureEffectsNAT[i]->ApplyMatrices(proj, view);
		}
		mTextureEffects[4]->ApplyMatrices(proj, view);
		if (gl_fuzztype != 0)
		{
			mTextureEffects[4 + gl_fuzztype]->ApplyMatrices(proj, view);
		}
		for (unsigned i = 12; i < mTextureEffects.Size(); i++)
		{
			mTextureEffects[i]->ApplyMatrices(proj, view);
		}
		for (int i = 0; i < MAX_EFFECTS; i++)
		{
			mEffectShaders[i]->ApplyMatrices(proj, view);
		}
		if (mActiveShader != NULL) mActiveShader->Bind();
	}
}